

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

wchar_t rd_stores(void)

{
  char *pcVar1;
  owner *poVar2;
  object *poVar3;
  store_conflict *s;
  ulong uVar4;
  uint8_t num;
  uint8_t own;
  uint16_t tmp16u;
  object *obj;
  uint8_t local_3c;
  byte local_3b;
  ushort local_3a;
  object *local_38;
  
  rd_u16b(&local_3a);
  if (local_3a != z_info->store_max) {
    pcVar1 = format("The number of stores in the savefile (%u) is different than expected (%u).");
    note(pcVar1);
  }
  if (local_3a != 0) {
    uVar4 = 0;
    do {
      s = stores + uVar4;
      if (z_info->store_max <= uVar4) {
        s = (store_conflict *)0x0;
      }
      rd_byte(&local_3b);
      rd_byte(&local_3c);
      if (s != (store_conflict *)0x0) {
        poVar2 = store_ownerbyidx(s,(uint)local_3b);
        s->owner = poVar2;
      }
      for (; local_3c != '\0'; local_3c = local_3c + 0xff) {
        poVar3 = rd_item();
        if (poVar3 == (object *)0x0) {
          pcVar1 = "Error reading known item";
LAB_0016369e:
          note(pcVar1);
          return L'\xffffffff';
        }
        local_38 = rd_item();
        if (local_38 == (object *)0x0) {
          pcVar1 = "Error reading item";
          goto LAB_0016369e;
        }
        local_38->known = poVar3;
        if (((s == (store_conflict *)0x0) || (z_info->store_inven_max <= (ushort)s->stock_num)) ||
           (local_38->kind == (object_kind *)0x0)) {
          object_delete((chunk *)0x0,(chunk *)0x0,&local_38->known);
          object_delete((chunk *)0x0,(chunk *)0x0,&local_38);
        }
        else if (s->feat == 0xe) {
          home_carry(local_38);
        }
        else {
          store_carry(s,local_38);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_3a);
  }
  return L'\0';
}

Assistant:

int rd_stores(void) { return rd_stores_aux(rd_item); }